

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O0

string * vkt::image::anon_unknown_2::getAtomicFuncArgumentShaderStr
                   (string *__return_storage_ptr__,AtomicOperation op,string *x,string *y,string *z,
                   IVec3 *gridSize)

{
  allocator<char> local_315;
  int local_314;
  string local_310;
  int local_2ec;
  string local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  IVec3 *local_38;
  IVec3 *gridSize_local;
  string *z_local;
  string *y_local;
  string *x_local;
  string *psStack_10;
  AtomicOperation op_local;
  
  local_38 = gridSize;
  gridSize_local = (IVec3 *)z;
  z_local = y;
  y_local = x;
  x_local._4_4_ = op;
  psStack_10 = __return_storage_ptr__;
  if (op < ATOMIC_OPERATION_EXCHANGE) {
    std::operator+(&local_198,"(",x);
    std::operator+(&local_178,&local_198,"*");
    std::operator+(&local_158,&local_178,y_local);
    std::operator+(&local_138,&local_158," + ");
    std::operator+(&local_118,&local_138,z_local);
    std::operator+(&local_f8,&local_118,"*");
    std::operator+(&local_d8,&local_f8,z_local);
    std::operator+(&local_b8,&local_d8," + ");
    std::operator+(&local_98,&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gridSize_local);
    std::operator+(&local_78,&local_98,"*");
    std::operator+(&local_58,&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gridSize_local);
    std::operator+(__return_storage_ptr__,&local_58,")");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
  }
  else if (op == ATOMIC_OPERATION_EXCHANGE) {
    std::operator+(&local_2c8,"((",z);
    std::operator+(&local_2a8,&local_2c8,"*");
    local_2ec = tcu::Vector<int,_3>::x(local_38);
    de::toString<int>(&local_2e8,&local_2ec);
    std::operator+(&local_288,&local_2a8,&local_2e8);
    std::operator+(&local_268,&local_288," + ");
    std::operator+(&local_248,&local_268,y_local);
    std::operator+(&local_228,&local_248,")*");
    local_314 = tcu::Vector<int,_3>::y(local_38);
    de::toString<int>(&local_310,&local_314);
    std::operator+(&local_208,&local_228,&local_310);
    std::operator+(&local_1e8,&local_208," + ");
    std::operator+(&local_1c8,&local_1e8,z_local);
    std::operator+(__return_storage_ptr__,&local_1c8,")");
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)0x0,&local_315);
    std::allocator<char>::~allocator(&local_315);
  }
  return __return_storage_ptr__;
}

Assistant:

static string getAtomicFuncArgumentShaderStr (const AtomicOperation	op,
											  const string&			x,
											  const string&			y,
											  const string&			z,
											  const IVec3&			gridSize)
{
	switch (op)
	{
		case ATOMIC_OPERATION_ADD:
		case ATOMIC_OPERATION_MIN:
		case ATOMIC_OPERATION_MAX:
		case ATOMIC_OPERATION_AND:
		case ATOMIC_OPERATION_OR:
		case ATOMIC_OPERATION_XOR:
			return string("(" + x + "*" + x + " + " + y + "*" + y + " + " + z + "*" + z + ")");
		case ATOMIC_OPERATION_EXCHANGE:
			return string("((" + z + "*" + toString(gridSize.x()) + " + " + x + ")*" + toString(gridSize.y()) + " + " + y + ")");
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}